

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menus.cpp
# Opt level: O2

bool __thiscall
CMenus::DoButton_GridHeader
          (CMenus *this,void *pID,char *pText,bool Checked,int Align,CUIRect *pRect,int Corners)

{
  long lVar1;
  bool bVar2;
  undefined7 in_register_00000009;
  long in_FS_OFFSET;
  CUIRect Label;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000009,Checked) == 0) {
    if ((((this->super_CComponent).m_pClient)->m_UI).m_pHotItem == pID) {
      Label.x = 1.0;
      Label.y = 1.0;
      Label.w = 1.0;
      Label.h = 0.5;
      CUIRect::Draw(pRect,(vec4 *)&Label,5.0,Corners);
    }
  }
  else {
    Label._0_8_ = 0x3f6666663f666666;
    Label.w = 0.9;
    Label.h = 0.5;
    CUIRect::Draw(pRect,(vec4 *)&Label,5.0,Corners);
    ITextRender::TextColor
              (((this->super_CComponent).m_pClient)->m_pTextRender,&CUI::ms_HighlightTextColor);
    ITextRender::TextSecondaryColor
              (((this->super_CComponent).m_pClient)->m_pTextRender,
               &CUI::ms_HighlightTextOutlineColor);
  }
  CUIRect::VMargin(pRect,2.0,&Label);
  CUI::DoLabel(&((this->super_CComponent).m_pClient)->m_UI,&Label,pText,Label.h * 0.8 * 0.8,
               Align | 4,-1.0,true);
  if (Checked) {
    ITextRender::TextColor
              (((this->super_CComponent).m_pClient)->m_pTextRender,&CUI::ms_DefaultTextColor);
    ITextRender::TextSecondaryColor
              (((this->super_CComponent).m_pClient)->m_pTextRender,&CUI::ms_DefaultTextOutlineColor)
    ;
  }
  bVar2 = CUI::DoButtonLogic(&((this->super_CComponent).m_pClient)->m_UI,pID,pRect,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CMenus::DoButton_GridHeader(const void *pID, const char *pText, bool Checked, int Align, const CUIRect *pRect, int Corners)
{
	if(Checked)
	{
		pRect->Draw(vec4(0.9f, 0.9f, 0.9f, 0.5f), 5.0f, Corners);
		TextRender()->TextColor(CUI::ms_HighlightTextColor);
		TextRender()->TextSecondaryColor(CUI::ms_HighlightTextOutlineColor);
	}
	else if(UI()->HotItem() == pID)
	{
		pRect->Draw(vec4(1.0f, 1.0f, 1.0f, 0.5f), 5.0f, Corners);
	}

	CUIRect Label;
	pRect->VMargin(2.0f, &Label);
	UI()->DoLabel(&Label, pText, Label.h*CUI::ms_FontmodHeight*0.8f, Align|TEXTALIGN_MIDDLE);

	if(Checked)
	{
		TextRender()->TextColor(CUI::ms_DefaultTextColor);
		TextRender()->TextSecondaryColor(CUI::ms_DefaultTextOutlineColor);
	}

	return UI()->DoButtonLogic(pID, pRect);
}